

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

nullres nullcTestEvaluateExpressionTree(char *resultBuf,uint resultBufSize)

{
  bool bVar1;
  int iVar2;
  undefined1 local_40 [8];
  TraceScope traceScope;
  uint resultBufSize_local;
  char *resultBuf_local;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    resultBuf_local._7_1_ = '\0';
  }
  else {
    if (nullcTestEvaluateExpressionTree::token == '\0') {
      iVar2 = __cxa_guard_acquire(&nullcTestEvaluateExpressionTree::token);
      if (iVar2 != 0) {
        nullcTestEvaluateExpressionTree::token =
             NULLC::TraceGetToken("nullc","nullcTestEvaluateExpressionTree");
        __cxa_guard_release(&nullcTestEvaluateExpressionTree::token);
      }
    }
    NULLC::TraceScope::TraceScope((TraceScope *)local_40,nullcTestEvaluateExpressionTree::token);
    if (NULLC::compilerCtx == 0) {
      NULLC::nullcLastError = "ERROR: there is no active compiler context";
      resultBuf_local._7_1_ = '\0';
    }
    else {
      bVar1 = TestEvaluation((ExpressionContext *)(NULLC::compilerCtx + 0x18b8),
                             *(ExprBase **)(NULLC::compilerCtx + 0xa310),resultBuf,resultBufSize,
                             *(char **)(NULLC::compilerCtx + 0x20),
                             *(uint *)(NULLC::compilerCtx + 0x28));
      if (bVar1) {
        resultBuf_local._7_1_ = '\x01';
      }
      else {
        NULLC::nullcLastError = *(char **)(NULLC::compilerCtx + 0x20);
        resultBuf_local._7_1_ = '\0';
      }
    }
    NULLC::TraceScope::~TraceScope((TraceScope *)local_40);
  }
  return resultBuf_local._7_1_;
}

Assistant:

nullres nullcTestEvaluateExpressionTree(char *resultBuf, unsigned resultBufSize)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	TRACE_SCOPE("nullc", "nullcTestEvaluateExpressionTree");

	if(!compilerCtx)
	{
		nullcLastError = "ERROR: there is no active compiler context";
		return 0;
	}

	if(!TestEvaluation(compilerCtx->exprCtx, compilerCtx->exprModule, resultBuf, resultBufSize, compilerCtx->errorBuf, compilerCtx->errorBufSize))
	{
		nullcLastError = compilerCtx->errorBuf;
		return false;
	}

	return true;
}